

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

void YM2612_Write(ym2612_ *YM2612,UINT8 adr,UINT8 data)

{
  uint uVar1;
  int d;
  UINT8 data_local;
  UINT8 adr_local;
  ym2612_ *YM2612_local;
  
  switch(adr & 3) {
  case 0:
    YM2612->OPNAadr = (uint)data;
    break;
  case 1:
    if (YM2612->OPNAadr == 0x2a) {
      YM2612->DACdata = (data - 0x80) * 0x40;
    }
    else {
      uVar1 = YM2612->OPNAadr & 0xf0;
      if (uVar1 < 0x30) {
        YM2612->REG[0][YM2612->OPNAadr] = data;
        YM_SET(YM2612,YM2612->OPNAadr,data);
      }
      else if (YM2612->REG[0][YM2612->OPNAadr] != data) {
        YM2612->REG[0][YM2612->OPNAadr] = data;
        if (uVar1 < 0xa0) {
          SLOT_SET(YM2612,YM2612->OPNAadr,data);
        }
        else {
          CHANNEL_SET(YM2612,YM2612->OPNAadr,data);
        }
      }
    }
    break;
  case 2:
    YM2612->OPNBadr = (uint)data;
    break;
  case 3:
    uVar1 = YM2612->OPNBadr & 0xf0;
    if ((0x2f < uVar1) && (YM2612->REG[1][YM2612->OPNBadr] != data)) {
      YM2612->REG[1][YM2612->OPNBadr] = data;
      if (uVar1 < 0xa0) {
        SLOT_SET(YM2612,YM2612->OPNBadr + 0x100,data);
      }
      else {
        CHANNEL_SET(YM2612,YM2612->OPNBadr + 0x100,data);
      }
    }
  }
  return;
}

Assistant:

void YM2612_Write(ym2612_ *YM2612, UINT8 adr, UINT8 data)
{
  /**
   * Possible addresses:
   * - 0: Part 1 register number.
   * - 1: Part 1 data.
   * - 2: Part 2 register number.
   * - 3: Part 2 data.
   */

  int d;
  switch (adr & 0x03)
  {
    case 0:
      YM2612->OPNAadr = data;
      break;

    case 1:
      // Trivial optimisation
      if (YM2612->OPNAadr == 0x2A)
      {
        YM2612->DACdata = ((int)data - 0x80) << DAC_SHIFT;
        return /*0*/;
      }

      d = YM2612->OPNAadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[0][YM2612->OPNAadr] == data)
          return /*2*/;
        YM2612->REG[0][YM2612->OPNAadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNAadr, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNAadr, data);
        }
      }
      else          // YM2612
      {
        YM2612->REG[0][YM2612->OPNAadr] = data;

        YM_SET(YM2612, YM2612->OPNAadr, data);
      }
      break;

    case 2:
      YM2612->OPNBadr = data;
      break;

    case 3:
      d = YM2612->OPNBadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[1][YM2612->OPNBadr] == data)
          return /*2*/;
        YM2612->REG[1][YM2612->OPNBadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
      }
      else
        return /*1*/;
      break;
  }

  return /*0*/;
}